

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregatevulnerabilitytobin.cpp
# Opt level: O0

void doit(void)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_1014 [4];
  undefined1 auStack_1010 [4];
  AggregateVulnerability av;
  int lineno;
  char line [4096];
  
  fgets((char *)&av.vulnerability_id,0x1000,_stdin);
  av.aggregatevulnerability_id = 2;
  while( true ) {
    pcVar2 = fgets((char *)&av.vulnerability_id,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(&av.vulnerability_id,"%d,%d",local_1014,auStack_1010);
    if (iVar1 != 2) break;
    fwrite(local_1014,8,1,_stdout);
    av.aggregatevulnerability_id = av.aggregatevulnerability_id + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)(uint)av.aggregatevulnerability_id,
          &av.vulnerability_id);
  exit(1);
}

Assistant:

void doit() {

  char line[4096];
  fgets(line, sizeof(line), stdin);   // Read header
  int lineno = 2;
  AggregateVulnerability av;

  while (fgets(line, sizeof(line), stdin) != 0) {

    if (sscanf(line, "%d,%d", &av.aggregatevulnerability_id,
			      &av.vulnerability_id) != 2) {
      fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
      exit(EXIT_FAILURE);
    }
    
    fwrite(&av, sizeof(av), 1, stdout);
    ++lineno;

  }

}